

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateUint32ConstantOperandForDebugInfo
          (ValidationState_t *_,string *operand_name,Instruction *inst,uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  bool bVar1;
  spv_result_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_228;
  DiagnosticStream local_208;
  
  bVar1 = IsUint32Constant(_,(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[word_index]);
  sVar2 = SPV_SUCCESS;
  if (!bVar1) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator()(&bStack_228,ext_inst_name);
    std::operator<<((ostream *)&local_208,(string *)&bStack_228);
    std::operator<<((ostream *)&local_208,": expected operand ");
    std::operator<<((ostream *)&local_208,(string *)operand_name);
    std::operator<<((ostream *)&local_208," must be a result id of 32-bit unsigned OpConstant");
    std::__cxx11::string::_M_dispose();
    DiagnosticStream::~DiagnosticStream(&local_208);
    sVar2 = local_208.error_;
  }
  return sVar2;
}

Assistant:

spv_result_t ValidateUint32ConstantOperandForDebugInfo(
    ValidationState_t& _, const std::string& operand_name,
    const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  if (!IsUint32Constant(_, inst->word(word_index))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": expected operand " << operand_name
           << " must be a result id of 32-bit unsigned OpConstant";
  }
  return SPV_SUCCESS;
}